

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall crypto_tests::aes_testvectors::test_method(aes_testvectors *this)

{
  long in_FS_OFFSET;
  allocator<char> local_73;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f",
             &local_71);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"00112233445566778899aabbccddeeff",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"8ea2b7ca516745bfeafc49904b496089",&local_73);
  CryptoTest::TestAES256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4",
             &local_71);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"6bc1bee22e409f96e93d7e117393172a",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"f3eed1bdb5d2a03c064b5a7e3db181f8",&local_73);
  CryptoTest::TestAES256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4",
             &local_71);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"ae2d8a571e03ac9c9eb76fac45af8e51",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"591ccb10d410ed26dc5ba74a31362870",&local_73);
  CryptoTest::TestAES256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4",
             &local_71);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"30c81c46a35ce411e5fbc1191a0a52ef",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"b6ed21b99ca6f4f9f153e7b1beafed1d",&local_73);
  CryptoTest::TestAES256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4",
             &local_71);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"f69f2445df4f9b17ad2b417be66c3710",&local_72);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"23304b7a39f9f3ff067d8d8f9e24ecc7",&local_73);
  CryptoTest::TestAES256(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(aes_testvectors) {
    // AES test vectors from FIPS 197.
    TestAES256("000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f", "00112233445566778899aabbccddeeff", "8ea2b7ca516745bfeafc49904b496089");

    // AES-ECB test vectors from NIST sp800-38a.
    TestAES256("603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4", "6bc1bee22e409f96e93d7e117393172a", "f3eed1bdb5d2a03c064b5a7e3db181f8");
    TestAES256("603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4", "ae2d8a571e03ac9c9eb76fac45af8e51", "591ccb10d410ed26dc5ba74a31362870");
    TestAES256("603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4", "30c81c46a35ce411e5fbc1191a0a52ef", "b6ed21b99ca6f4f9f153e7b1beafed1d");
    TestAES256("603deb1015ca71be2b73aef0857d77811f352c073b6108d72d9810a30914dff4", "f69f2445df4f9b17ad2b417be66c3710", "23304b7a39f9f3ff067d8d8f9e24ecc7");
}